

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

bool icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
               (UnicodeString *affixPattern,UnicodeSet *ignorables,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UErrorCode *in_R8;
  AffixTag AVar4;
  AffixUtils *local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  AffixTag tag;
  UErrorCode *status_local;
  UnicodeSet *ignorables_local;
  UnicodeString *affixPattern_local;
  
  tag._8_8_ = status;
  iVar3 = UnicodeString::length(affixPattern);
  if (iVar3 == 0) {
    affixPattern_local._7_1_ = true;
  }
  else {
    AffixTag::AffixTag((AffixTag *)local_38);
    do {
      do {
        bVar1 = hasNext((AffixTag *)local_38,affixPattern);
        if (!bVar1) {
          return true;
        }
        AVar4._8_8_ = affixPattern;
        AVar4.offset = tag.offset;
        AVar4.codePoint = tag.codePoint;
        AVar4 = nextToken((AffixUtils *)local_38,AVar4,(UnicodeString *)tag._8_8_,in_R8);
        local_48 = AVar4._0_8_;
        local_38 = (undefined1  [8])local_48;
        local_40 = AVar4._8_8_;
        tag.offset = local_40._0_4_;
        tag.codePoint = local_40._4_4_;
        UVar2 = ::U_FAILURE(*(UErrorCode *)tag._8_8_);
        if (UVar2 != '\0') {
          return false;
        }
      } while (tag.codePoint != 0);
      UVar2 = UnicodeSet::contains(ignorables,local_38._4_4_);
    } while (UVar2 != '\0');
    affixPattern_local._7_1_ = false;
  }
  return affixPattern_local._7_1_;
}

Assistant:

bool AffixUtils::containsOnlySymbolsAndIgnorables(const UnicodeString& affixPattern,
                                                  const UnicodeSet& ignorables, UErrorCode& status) {
    if (affixPattern.length() == 0) {
        return true;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type == TYPE_CODEPOINT && !ignorables.contains(tag.codePoint)) {
            return false;
        }
    }
    return true;
}